

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_lib.cc
# Opt level: O1

int CZopfliPNGOptimize(uchar *origpng,size_t origpng_size,CZopfliPNGOptions *png_options,int verbose
                      ,uchar **resultpng,size_t *resultpng_size)

{
  pointer __src;
  int iVar1;
  uchar *__dest;
  ZopfliPNGFilterStrategy *__args;
  long lVar2;
  size_t __size;
  long lVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resultpng_cc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> origpng_cc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  pointer local_98;
  iterator iStack_90;
  ZopfliPNGFilterStrategy *local_88;
  ushort local_80;
  pointer local_78;
  pointer pbStack_70;
  pointer local_68;
  bool local_60;
  undefined8 local_5c;
  int local_54;
  size_t *local_50;
  uchar **local_48;
  size_t local_40;
  uchar *local_38;
  
  local_98 = (pointer)0x0;
  iStack_90._M_current = (ZopfliPNGFilterStrategy *)0x0;
  local_88 = (ZopfliPNGFilterStrategy *)0x0;
  local_78 = (pointer)0x0;
  pbStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  local_a0._0_2_ = (ushort)(png_options->lossy_transparent != 0) << 8;
  local_a0[2] = png_options->lossy_8bit != 0;
  local_80 = (ushort)(png_options->auto_filter_strategy != 0);
  local_60 = png_options->use_zopfli != 0;
  local_5c._0_4_ = png_options->num_iterations;
  local_5c._4_4_ = png_options->num_iterations_large;
  local_54 = png_options->block_split_strategy;
  local_50 = resultpng_size;
  local_48 = resultpng;
  local_38 = origpng;
  if (0 < png_options->num_filter_strategies) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      __args = (ZopfliPNGFilterStrategy *)((long)png_options->filter_strategies + lVar2);
      if (iStack_90._M_current == local_88) {
        std::vector<ZopfliPNGFilterStrategy,std::allocator<ZopfliPNGFilterStrategy>>::
        _M_realloc_insert<ZopfliPNGFilterStrategy_const&>
                  ((vector<ZopfliPNGFilterStrategy,std::allocator<ZopfliPNGFilterStrategy>> *)
                   &local_98,iStack_90,__args);
      }
      else {
        *iStack_90._M_current = *__args;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 4;
    } while (lVar3 < png_options->num_filter_strategies);
  }
  local_40 = origpng_size;
  if (0 < png_options->num_keepchunks) {
    lVar2 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,png_options->keepchunks[lVar2],(allocator<char> *)&local_d8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 &local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < png_options->num_keepchunks);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c0,local_38,
             local_38 + local_40,(allocator_type *)&local_d8);
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = ZopfliPNGOptimize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,
                            (ZopfliPNGOptions *)local_a0,verbose != 0,&local_d8);
  __src = local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (iVar1 == 0) {
    __size = (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    *local_50 = __size;
    __dest = (uchar *)malloc(__size);
    *local_48 = __dest;
    if (__dest == (uchar *)0x0) {
      iVar1 = 0xc;
    }
    else {
      memcpy(__dest,__src,__size);
      iVar1 = 0;
    }
  }
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return iVar1;
}

Assistant:

int CZopfliPNGOptimize(const unsigned char* origpng,
                                  const size_t origpng_size,
                                  const CZopfliPNGOptions* png_options,
                                  int verbose,
                                  unsigned char** resultpng,
                                  size_t* resultpng_size) {
  ZopfliPNGOptions opts;

  // Copy over to the C++-style struct
  opts.lossy_transparent    = !!png_options->lossy_transparent;
  opts.lossy_8bit           = !!png_options->lossy_8bit;
  opts.auto_filter_strategy = !!png_options->auto_filter_strategy;
  opts.use_zopfli           = !!png_options->use_zopfli;
  opts.num_iterations       = png_options->num_iterations;
  opts.num_iterations_large = png_options->num_iterations_large;
  opts.block_split_strategy = png_options->block_split_strategy;

  for (int i = 0; i < png_options->num_filter_strategies; i++) {
    opts.filter_strategies.push_back(png_options->filter_strategies[i]);
  }

  for (int i = 0; i < png_options->num_keepchunks; i++) {
    opts.keepchunks.push_back(png_options->keepchunks[i]);
  }

  const std::vector<unsigned char> origpng_cc(origpng, origpng + origpng_size);
  std::vector<unsigned char> resultpng_cc;

  int ret = ZopfliPNGOptimize(origpng_cc, opts, !!verbose, &resultpng_cc);
  if (ret) {
    return ret;
  }

  *resultpng_size = resultpng_cc.size();
  *resultpng      = (unsigned char*) malloc(resultpng_cc.size());
  if (!(*resultpng)) {
    return ENOMEM;
  }

  memcpy(*resultpng,
         reinterpret_cast<unsigned char*>(&resultpng_cc[0]),
         resultpng_cc.size());

  return 0;
}